

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

Vec_Wec_t * Acb_DeriveCnfForWindow(Acb_Ntk_t *p,Vec_Int_t *vWin,int PivotVar)

{
  int iVar1;
  int iVar2;
  Vec_Str_t *p_00;
  int local_34;
  int iObj;
  int i;
  Vec_Str_t *vCnfBase;
  Vec_Wec_t *vCnfs;
  int PivotVar_local;
  Vec_Int_t *vWin_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Vec_WecSize(&p->vCnfs);
  iVar2 = Acb_NtkObjNumMax(p);
  if (iVar1 == iVar2) {
    for (local_34 = 0; iVar1 = Vec_IntSize(vWin), local_34 < iVar1; local_34 = local_34 + 1) {
      iVar1 = Vec_IntEntry(vWin,local_34);
      iVar2 = Abc_LitIsCompl(iVar1);
      if ((iVar2 == 0) || (PivotVar <= local_34)) {
        iVar1 = Abc_Lit2Var(iVar1);
        p_00 = Acb_ObjCnfs(p,iVar1);
        iVar2 = Vec_StrSize(p_00);
        if (iVar2 < 1) {
          Acb_DeriveCnfForWindowOne(p,iVar1);
        }
      }
    }
    return &p->vCnfs;
  }
  __assert_fail("Vec_WecSize(vCnfs) == Acb_NtkObjNumMax(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                ,0x6c,"Vec_Wec_t *Acb_DeriveCnfForWindow(Acb_Ntk_t *, Vec_Int_t *, int)");
}

Assistant:

Vec_Wec_t * Acb_DeriveCnfForWindow( Acb_Ntk_t * p, Vec_Int_t * vWin, int PivotVar )
{
    Vec_Wec_t * vCnfs = &p->vCnfs;
    Vec_Str_t * vCnfBase; int i, iObj;
    assert( Vec_WecSize(vCnfs) == Acb_NtkObjNumMax(p) );
    Vec_IntForEachEntry( vWin, iObj, i )
    {
        if ( Abc_LitIsCompl(iObj) && i < PivotVar )
            continue;
        iObj = Abc_Lit2Var(iObj);
        vCnfBase = Acb_ObjCnfs( p, iObj );
        if ( Vec_StrSize(vCnfBase) > 0 )
            continue;
        Acb_DeriveCnfForWindowOne( p, iObj );
    }
    return vCnfs;
}